

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libdivide.h
# Opt level: O2

divider<unsigned_long,_(libdivide::Branching)0> generate_1_divisor<unsigned_long>(unsigned_long d)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  divider<unsigned_long,_(libdivide::Branching)0> dVar9;
  ulong uVar4;
  
  if (d != 0) {
    uVar6 = (uint)LZCOUNT(d) ^ 0x3f;
    bVar5 = (byte)uVar6;
    if ((d - 1 & d) == 0) {
      uVar3 = 0;
    }
    else {
      uVar8 = 1L << ((ulong)uVar6 & 0x3f);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = d;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar8;
      uVar4 = 0;
      lVar7 = SUB168((auVar2 << 0x40) % auVar1,0);
      if (uVar8 <= d - lVar7) {
        bVar5 = bVar5 | 0x40;
        uVar4 = (ulong)(lVar7 < 0 || d <= (ulong)(lVar7 * 2));
      }
      uVar3 = uVar4 + 1;
    }
    dVar9.div.denom.more = bVar5;
    dVar9.div.denom.magic = uVar3;
    return (divider<unsigned_long,_(libdivide::Branching)0>)dVar9.div.denom;
  }
  fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x44c,"libdivide_internal_u64_gen",
          "divider must be != 0");
  abort();
}

Assistant:

static LIBDIVIDE_INLINE struct libdivide_u64_t libdivide_internal_u64_gen(
    uint64_t d, int branchfree) {
    if (d == 0) {
        LIBDIVIDE_ERROR("divider must be != 0");
    }

    struct libdivide_u64_t result;
    uint32_t floor_log_2_d = 63 - libdivide_count_leading_zeros64(d);

    // Power of 2
    if ((d & (d - 1)) == 0) {
        // We need to subtract 1 from the shift value in case of an unsigned
        // branchfree divider because there is a hardcoded right shift by 1
        // in its division algorithm. Because of this we also need to add back
        // 1 in its recovery algorithm.
        result.magic = 0;
        result.more = (uint8_t)(floor_log_2_d - (branchfree != 0));
    } else {
        uint64_t proposed_m, rem;
        uint8_t more;
        // (1 << (64 + floor_log_2_d)) / d
        proposed_m = libdivide_128_div_64_to_64((uint64_t)1 << floor_log_2_d, 0, d, &rem);

        LIBDIVIDE_ASSERT(rem > 0 && rem < d);
        const uint64_t e = d - rem;

        // This power works if e < 2**floor_log_2_d.
        if (!branchfree && e < ((uint64_t)1 << floor_log_2_d)) {
            // This power works
            more = (uint8_t)floor_log_2_d;
        } else {
            // We have to use the general 65-bit algorithm.  We need to compute
            // (2**power) / d. However, we already have (2**(power-1))/d and
            // its remainder. By doubling both, and then correcting the
            // remainder, we can compute the larger division.
            // don't care about overflow here - in fact, we expect it
            proposed_m += proposed_m;
            const uint64_t twice_rem = rem + rem;
            if (twice_rem >= d || twice_rem < rem) proposed_m += 1;
            more = (uint8_t)(floor_log_2_d | LIBDIVIDE_ADD_MARKER);
        }
        result.magic = 1 + proposed_m;
        result.more = more;
        // result.more's shift should in general be ceil_log_2_d. But if we
        // used the smaller power, we subtract one from the shift because we're
        // using the smaller power. If we're using the larger power, we
        // subtract one from the shift because it's taken care of by the add
        // indicator. So floor_log_2_d happens to be correct in both cases,
        // which is why we do it outside of the if statement.
    }
    return result;
}